

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_long,long_double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_long *t_lhs,
          unsigned_long *c_lhs,longdouble *c_rhs)

{
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  Boxed_Value BVar5;
  longdouble local_78;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  longdouble *local_38;
  longdouble *c_rhs_local;
  unsigned_long *c_lhs_local;
  unsigned_long *t_lhs_local;
  Boxed_Value *t_bv_local;
  Boxed_Number *pBStack_10;
  Opers t_oper_local;
  
  local_38 = c_rhs;
  c_rhs_local = (longdouble *)c_lhs;
  c_lhs_local = t_lhs;
  t_lhs_local = (unsigned_long *)t_bv;
  t_bv_local._4_4_ = t_oper;
  pBStack_10 = this;
  switch(t_oper) {
  case equals:
    BVar5 = const_var((chaiscript *)this,
                      (longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
                      (longdouble)(long)*c_lhs == *c_rhs);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case less_than:
    BVar5 = const_var((chaiscript *)this,
                      (longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
                      (longdouble)(long)*c_lhs < *c_rhs);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case greater_than:
    BVar5 = const_var((chaiscript *)this,
                      *c_rhs < (longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4)
                               + (longdouble)(long)*c_lhs);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case less_than_equal:
    BVar5 = const_var((chaiscript *)this,
                      (longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
                      (longdouble)(long)*c_lhs <= *c_rhs);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case greater_than_equal:
    BVar5 = const_var((chaiscript *)this,
                      *c_rhs <= (longdouble)
                                *(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
                                (longdouble)(long)*c_lhs);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case not_equal:
    BVar5 = const_var((chaiscript *)this,
                      (longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
                      (longdouble)(long)*c_lhs != *c_rhs);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    if (t_lhs == (unsigned_long *)0x0) {
LAB_005a1f35:
      this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
      memset(this_00,0,8);
      detail::exception::bad_any_cast::bad_any_cast(this_00);
      __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                  detail::exception::bad_any_cast::~bad_any_cast);
    }
    switch(t_oper) {
    case assign:
      lVar3 = *c_rhs;
      lVar4 = (longdouble)9.223372e+18;
      lVar2 = (longdouble)0;
      if (lVar4 <= lVar3) {
        lVar2 = lVar4;
      }
      *t_lhs = (long)ROUND(lVar3 - lVar2) ^ (ulong)(lVar4 <= lVar3) << 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var1._M_pi = extraout_RDX;
      break;
    default:
      goto LAB_005a1f35;
    case assign_product:
      lVar4 = ((longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*t_lhs < 0) * 4) +
              (longdouble)(long)*t_lhs) * *c_rhs;
      lVar2 = (longdouble)9.223372e+18;
      lVar3 = (longdouble)0;
      if (lVar2 <= lVar4) {
        lVar3 = lVar2;
      }
      *t_lhs = (long)ROUND(lVar4 - lVar3) ^ (ulong)(lVar2 <= lVar4) << 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var1._M_pi = extraout_RDX_00;
      break;
    case assign_sum:
      lVar4 = (longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*t_lhs < 0) * 4) +
              (longdouble)(long)*t_lhs + *c_rhs;
      lVar2 = (longdouble)9.223372e+18;
      lVar3 = (longdouble)0;
      if (lVar2 <= lVar4) {
        lVar3 = lVar2;
      }
      *t_lhs = (long)ROUND(lVar4 - lVar3) ^ (ulong)(lVar2 <= lVar4) << 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var1._M_pi = extraout_RDX_01;
      break;
    case assign_quotient:
      check_divide_by_zero<long_double>(*c_rhs);
      lVar4 = ((longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs_local < 0) * 4) +
              (longdouble)(long)*c_lhs_local) / *local_38;
      lVar2 = (longdouble)9.223372e+18;
      lVar3 = (longdouble)0;
      if (lVar2 <= lVar4) {
        lVar3 = lVar2;
      }
      *c_lhs_local = (long)ROUND(lVar4 - lVar3) ^ (ulong)(lVar2 <= lVar4) << 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,(Boxed_Value *)t_lhs_local);
      _Var1._M_pi = extraout_RDX_02;
      break;
    case assign_difference:
      lVar4 = ((longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*t_lhs < 0) * 4) +
              (longdouble)(long)*t_lhs) - *c_rhs;
      lVar2 = (longdouble)9.223372e+18;
      lVar3 = (longdouble)0;
      if (lVar2 <= lVar4) {
        lVar3 = lVar2;
      }
      *t_lhs = (long)ROUND(lVar4 - lVar3) ^ (ulong)(lVar2 <= lVar4) << 0x3f;
      Boxed_Value::Boxed_Value(&this->bv,t_bv);
      _Var1._M_pi = extraout_RDX_03;
    }
    break;
  case sum:
    local_48 = *c_rhs + (longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
                        (longdouble)(long)*c_lhs;
    BVar5 = const_var<long_double>((chaiscript *)this,&local_48);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case quotient:
    check_divide_by_zero<long_double>(*c_rhs);
    local_58 = ((longdouble)*(float *)(&DAT_0064a148 + (ulong)(*(long *)c_rhs_local < 0) * 4) +
               (longdouble)*(long *)c_rhs_local) / *local_38;
    BVar5 = const_var<long_double>((chaiscript *)this,&local_58);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case product:
    local_68 = *c_rhs * ((longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
                        (longdouble)(long)*c_lhs);
    BVar5 = const_var<long_double>((chaiscript *)this,&local_68);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case difference:
    local_78 = ((longdouble)*(float *)(&DAT_0064a148 + (ulong)((long)*c_lhs < 0) * 4) +
               (longdouble)(long)*c_lhs) - *c_rhs;
    BVar5 = const_var<long_double>((chaiscript *)this,&local_78);
    _Var1._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }